

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeMarkTFI_rec(Gia_Man_t *p,int Id,Vec_Bit_t *vMarked)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vMarked_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,Id);
  iVar1 = Vec_BitEntry(vMarked,Id);
  if (iVar1 == 0) {
    Vec_BitWriteEntry(vMarked,Id,1);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,Id);
      Acec_TreeMarkTFI_rec(p,iVar1,vMarked);
      iVar1 = Gia_ObjFaninId1(pObj_00,Id);
      Acec_TreeMarkTFI_rec(p,iVar1,vMarked);
    }
  }
  return;
}

Assistant:

void Acec_TreeMarkTFI_rec( Gia_Man_t * p, int Id, Vec_Bit_t * vMarked )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, Id);
    if ( Vec_BitEntry(vMarked, Id) )
        return;
    Vec_BitWriteEntry( vMarked, Id, 1 );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Acec_TreeMarkTFI_rec( p, Gia_ObjFaninId0(pObj, Id), vMarked );
    Acec_TreeMarkTFI_rec( p, Gia_ObjFaninId1(pObj, Id), vMarked );
}